

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

void outputPtrBytes(void *val,char *outBuf,int32_t *outIx,int32_t capacity)

{
  char *local_38;
  char *p;
  uint local_28;
  int32_t incVal;
  uint32_t i;
  int32_t capacity_local;
  int32_t *outIx_local;
  char *outBuf_local;
  void *val_local;
  
  local_38 = (char *)((long)&outBuf_local + 7);
  outBuf_local = (char *)val;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    outputHexBytes((long)*local_38,2,outBuf,outIx,capacity);
    local_38 = local_38 + -1;
  }
  return;
}

Assistant:

static void outputPtrBytes(void *val, char *outBuf, int32_t *outIx, int32_t capacity) {
    uint32_t  i;
    int32_t  incVal = 1;              /* +1 for big endian, -1 for little endian          */
    char     *p     = (char *)&val;   /* point to current byte to output in the ptr val  */

#if !U_IS_BIG_ENDIAN
    /* Little Endian.  Move p to most significant end of the value      */
    incVal = -1;
    p += sizeof(void *) - 1;
#endif

    /* Loop through the bytes of the ptr as it sits in memory, from 
     * most significant to least significant end                    */
    for (i=0; i<sizeof(void *); i++) {
        outputHexBytes(*p, 2, outBuf, outIx, capacity);
        p += incVal;
    }
}